

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O2

void __thiscall
Fl_Simple_Counter::Fl_Simple_Counter(Fl_Simple_Counter *this,int X,int Y,int W,int H,char *L)

{
  Fl_Counter::Fl_Counter(&this->super_Fl_Counter,X,Y,W,H,L);
  (this->super_Fl_Counter).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Counter_00277170;
  (this->super_Fl_Counter).super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  return;
}

Assistant:

Fl_Simple_Counter::Fl_Simple_Counter(int X,int Y,int W,int H, const char *L)
: Fl_Counter(X,Y,W,H,L) {
  type(FL_SIMPLE_COUNTER);
}